

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O0

void __thiscall StochasticProcess::~StochasticProcess(StochasticProcess *this)

{
  StochasticProcess *this_local;
  
  (this->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0018ebb0;
  (this->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__StochasticProcess_0018ec38;
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__StochasticProcess_0018ec80;
  std::__cxx11::string::~string((string *)&this->stochDescription);
  Physical::~Physical(&this->super_Physical);
  TimeDependent::~TimeDependent(&this->super_TimeDependent);
  Parametric::~Parametric(&this->super_Parametric);
  return;
}

Assistant:

virtual ~StochasticProcess() {}